

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void ImFontAtlasBuildRender32bppRectFromString
               (ImFontAtlas *atlas,int x,int y,int w,int h,char *in_str,char in_marker_char,
               uint in_marker_pixel_value)

{
  bool bVar1;
  uint local_40;
  int local_38;
  int local_34;
  int off_x;
  int off_y;
  uint *out_pixel;
  char *in_str_local;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  ImFontAtlas *atlas_local;
  
  bVar1 = false;
  if (-1 < x) {
    bVar1 = x + w <= atlas->TexWidth;
  }
  if (!bVar1) {
    __assert_fail("x >= 0 && x + w <= atlas->TexWidth",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0xa52,
                  "void ImFontAtlasBuildRender32bppRectFromString(ImFontAtlas *, int, int, int, int, const char *, char, unsigned int)"
                 );
  }
  bVar1 = false;
  if (-1 < y) {
    bVar1 = y + h <= atlas->TexHeight;
  }
  if (!bVar1) {
    __assert_fail("y >= 0 && y + h <= atlas->TexHeight",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0xa53,
                  "void ImFontAtlasBuildRender32bppRectFromString(ImFontAtlas *, int, int, int, int, const char *, char, unsigned int)"
                 );
  }
  _off_x = atlas->TexPixelsRGBA32 + (long)x + (long)(y * atlas->TexWidth);
  out_pixel = (uint *)in_str;
  for (local_34 = 0; local_34 < h; local_34 = local_34 + 1) {
    for (local_38 = 0; local_38 < w; local_38 = local_38 + 1) {
      if (*(char *)((long)out_pixel + (long)local_38) == in_marker_char) {
        local_40 = in_marker_pixel_value;
      }
      else {
        local_40 = 0;
      }
      _off_x[local_38] = local_40;
    }
    _off_x = _off_x + atlas->TexWidth;
    out_pixel = (uint *)((long)out_pixel + (long)w);
  }
  return;
}

Assistant:

void ImFontAtlasBuildRender32bppRectFromString(ImFontAtlas* atlas, int x, int y, int w, int h, const char* in_str, char in_marker_char, unsigned int in_marker_pixel_value)
{
    IM_ASSERT(x >= 0 && x + w <= atlas->TexWidth);
    IM_ASSERT(y >= 0 && y + h <= atlas->TexHeight);
    unsigned int* out_pixel = atlas->TexPixelsRGBA32 + x + (y * atlas->TexWidth);
    for (int off_y = 0; off_y < h; off_y++, out_pixel += atlas->TexWidth, in_str += w)
        for (int off_x = 0; off_x < w; off_x++)
            out_pixel[off_x] = (in_str[off_x] == in_marker_char) ? in_marker_pixel_value : IM_COL32_BLACK_TRANS;
}